

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O2

Expression * __thiscall
wasm::Vacuum::optimize(Vacuum *this,Expression *curr,bool resultUsed,bool typeMatters)

{
  Type *this_00;
  size_t *this_01;
  uintptr_t uVar1;
  bool bVar2;
  Expression **ppEVar3;
  long lVar4;
  Expression *pEVar5;
  Expression *ast;
  Iterator IVar6;
  undefined1 local_3f0 [8];
  EffectAnalyzer self;
  SmallVector<wasm::Literal,_1UL> local_110;
  AbstractChildIterator<wasm::ChildIterator> local_d8;
  undefined1 local_98 [8];
  SmallVector<wasm::Expression_*,_1UL> childrenWithEffects;
  Expression *child;
  Iterator local_60;
  Expression *local_50;
  undefined8 local_48;
  Expression *local_40;
  char local_31;
  
  uVar1 = (curr->type).id;
  pEVar5 = curr;
  if (uVar1 != 1) {
    if (resultUsed) {
      if (uVar1 == 0) {
        __assert_fail("!resultUsed || curr->type != Type::none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Vacuum.cpp"
                      ,0x60,"Expression *wasm::Vacuum::optimize(Expression *, bool, bool)");
      }
    }
    else {
      local_31 = uVar1 == 0 || typeMatters;
      this_01 = &self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      ast = curr;
      do {
        if ((local_31 != '\0') && ((ast->type).id != uVar1)) {
          return curr;
        }
        if (((ulong)ast->_id < 0x32) && ((0x200000004000eU >> ((ulong)ast->_id & 0x3f) & 1) != 0)) {
          return ast;
        }
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)local_3f0,
                   &((this->
                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                     ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                   ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                   super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                   super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule);
        local_40 = ast;
        EffectAnalyzer::visit((EffectAnalyzer *)local_3f0,ast);
        bVar2 = EffectAnalyzer::hasUnremovableSideEffects((EffectAnalyzer *)local_3f0);
        if (bVar2) {
          local_48 = 0;
          ast = local_40;
          pEVar5 = local_40;
        }
        else {
          local_98 = (undefined1  [8])0x0;
          childrenWithEffects.fixed._M_elems[0] = (_Type)(Expression *)0x0;
          childrenWithEffects.flexible.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          childrenWithEffects.flexible.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_d8,local_40);
          local_60.index = 0;
          local_60.parent = &local_d8;
          IVar6 = AbstractChildIterator<wasm::ChildIterator>::end(&local_d8);
          while ((local_60.index != IVar6.index || (local_60.parent != IVar6.parent))) {
            ppEVar3 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_60);
            childrenWithEffects.flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*ppEVar3;
            EffectAnalyzer::EffectAnalyzer
                      ((EffectAnalyzer *)this_01,
                       &((this->
                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                         ).super_Pass.runner)->options,
                       (this->
                       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                       ).
                       super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                       .super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                       super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule,
                       (Expression *)
                       childrenWithEffects.flexible.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar2 = EffectAnalyzer::hasUnremovableSideEffects((EffectAnalyzer *)this_01);
            EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)this_01);
            if (bVar2) {
              SmallVector<wasm::Expression_*,_1UL>::push_back
                        ((SmallVector<wasm::Expression_*,_1UL> *)local_98,
                         (Expression **)
                         &childrenWithEffects.flexible.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            local_60.index = local_60.index + 1;
          }
          std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
          ~_Vector_base(&local_d8.children.flexible.
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       );
          lVar4 = ((long)childrenWithEffects.flexible.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                   (long)childrenWithEffects.fixed._M_elems[0] >> 3) + (long)local_98;
          if (lVar4 == 0) {
            local_48 = 0;
            local_50 = (Expression *)0x0;
            ast = local_40;
          }
          else if (lVar4 == 1) {
            local_48 = CONCAT71((int7)((ulong)local_40 >> 8),1);
            ast = (Expression *)childrenWithEffects.usedFixed;
          }
          else {
            this_00 = &local_40->type;
            bVar2 = wasm::Type::isDefaultable(this_00);
            if (bVar2) {
              self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)(this->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                           .super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                           super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule
              ;
              Literal::makeZeros((Literals *)&local_110,(Type)this_00->id);
              pEVar5 = Builder::makeConstantExpression((Builder *)this_01,(Literals *)&local_110);
              SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_110);
              ast = local_40;
              local_50 = getDroppedChildrenAndAppend
                                   (local_40,(this->
                                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                             ).
                                             super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                             .
                                             super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                             .
                                             super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                             .currModule,
                                    &((this->
                                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                      ).super_Pass.runner)->options,pEVar5);
              local_48 = 0;
            }
            else {
              local_48 = 0;
              local_50 = local_40;
              ast = local_40;
            }
          }
          std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                    ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     &childrenWithEffects.fixed);
          pEVar5 = local_50;
        }
        curr = local_40;
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_3f0);
        local_50 = pEVar5;
      } while ((char)local_48 != '\0');
    }
  }
  return pEVar5;
}

Assistant:

Expression* optimize(Expression* curr, bool resultUsed, bool typeMatters) {
    auto type = curr->type;
    // If the type is none, then we can never replace it with another type.
    if (type == Type::none) {
      typeMatters = true;
    }
    // An unreachable node must not be changed. DCE will remove those.
    if (type == Type::unreachable) {
      return curr;
    }
    // resultUsed only makes sense when the type is concrete
    assert(!resultUsed || curr->type != Type::none);
    // If we actually need the result, then we must not change anything.
    // TODO: maybe there is something clever though?
    if (resultUsed) {
      return curr;
    }
    // We iterate on possible replacements.
    auto* prev = curr;
    while (1) {
      // If a replacement changes the type, and the type matters, return the
      // previous one and stop.
      if (typeMatters && curr->type != type) {
        return prev;
      }
      prev = curr;
      // Some instructions have special handling in visit*, and we should do
      // nothing for them here.
      if (curr->is<Drop>() || curr->is<Block>() || curr->is<If>() ||
          curr->is<Loop>() || curr->is<Try>()) {
        return curr;
      }
      // Check if this expression itself has side effects, ignoring children.
      EffectAnalyzer self(getPassOptions(), *getModule());
      self.visit(curr);
      if (self.hasUnremovableSideEffects()) {
        return curr;
      }
      // The result isn't used, and this has no side effects itself, so we can
      // get rid of it. However, the children may have side effects.
      SmallVector<Expression*, 1> childrenWithEffects;
      for (auto* child : ChildIterator(curr)) {
        if (EffectAnalyzer(getPassOptions(), *getModule(), child)
              .hasUnremovableSideEffects()) {
          childrenWithEffects.push_back(child);
        }
      }
      if (childrenWithEffects.empty()) {
        return nullptr;
      }
      if (childrenWithEffects.size() == 1) {
        // We know the result isn't used, and curr has no side effects, so we
        // can skip curr and keep looking into the child.
        curr = childrenWithEffects[0];
        continue;
      }
      // The result is not used, but multiple children have side effects, so we
      // need to keep them around. We must also return something of the proper
      // type - if we can do that, replace everything with the children + a
      // dummy value of the proper type.
      if (curr->type.isDefaultable()) {
        auto* dummy = Builder(*getModule())
                        .makeConstantExpression(Literal::makeZeros(curr->type));
        return getDroppedChildrenAndAppend(
          curr, *getModule(), getPassOptions(), dummy);
      }
      // Otherwise, give up.
      return curr;
    }
  }